

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O3

size_t green_poller_used(green_poller_t poller)

{
  ulong uVar1;
  uint uStack_24;
  
  if (poller == (green_poller_t)0x0) {
    return 0;
  }
  if (poller->loop == (green_loop_t_conflict)0x0) {
    green_poller_used_cold_3();
  }
  else {
    uVar1 = poller->used;
    if (uVar1 <= poller->size) {
      if (uVar1 < poller->busy) {
        green_poller_used_cold_1();
        return 0;
      }
      return uVar1;
    }
  }
  green_poller_used_cold_2();
  if (poller == (green_poller_t)0x0) {
    return 0;
  }
  if (poller->loop == (green_loop_t_conflict)0x0) {
    green_poller_done_cold_3();
  }
  else {
    uVar1 = poller->used;
    if (uVar1 <= poller->size) {
      if (uVar1 < poller->busy) {
        green_poller_done_cold_1();
        return 0;
      }
      return uVar1 - poller->busy;
    }
  }
  green_poller_done_cold_2();
  if (poller != (green_poller_t)0x0) {
    if (0 < poller->refs) {
      poller->refs = poller->refs + 1;
      return 0;
    }
    green_poller_acquire_cold_1();
    if (poller == (green_poller_t)0x0) {
      return 1;
    }
    green_future_release_cold_1();
    return (ulong)uStack_24;
  }
  return 1;
}

Assistant:

size_t green_poller_used(green_poller_t poller)
{
    if (poller == NULL) {
        return 0;
    }
    green_assert(poller->loop != NULL);
    green_assert(poller->size >= poller->used);
    green_assert(poller->used >= poller->busy);
    return poller->used;
}